

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O2

int testSpanTestsIterationMultipleDims(void)

{
  int *piVar1;
  size_t sVar2;
  ostream *poVar3;
  long lVar4;
  uint uVar5;
  pointer ptVar6;
  undefined4 *puVar7;
  pointer ptVar8;
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator> *pIVar9;
  int iVar10;
  long lVar11;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator> local_100;
  vector<int,_std::allocator<int>_> values;
  Span<const_int,_18446744073709551615UL> span2d;
  vector<int,_std::allocator<int>_> expectedRowSums;
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
  local_a0 [3];
  Span<const_int,_18446744073709551615UL> span;
  
  puVar7 = &DAT_002986bc;
  pIVar9 = local_a0;
  for (lVar4 = 0x18; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined4 *)&(pIVar9->m_begin).m_ptr = *puVar7;
    puVar7 = puVar7 + 1;
    pIVar9 = (IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
              *)((long)&(pIVar9->m_begin).m_ptr + 4);
  }
  __l._M_len = 0x18;
  __l._M_array = (iterator)local_a0;
  std::vector<int,_std::allocator<int>_>::vector(&values,__l,(allocator_type *)&local_100);
  local_a0[0].m_begin.m_ptr = (pointer)0x1a0000000a;
  local_a0[0].m_begin.m_stride._0_4_ = 0x2a;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_a0;
  std::vector<int,_std::allocator<int>_>::vector
            (&expectedRowSums,__l_00,(allocator_type *)&local_100);
  span.m_ptr = (pointer)0x0;
  if ((long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    span.m_ptr = values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  }
  span.m_size.m_size =
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  MILBlob::Util::Span<const_int,_18446744073709551615UL>::IterateByDimension(local_a0,&span,2);
  sVar2 = CONCAT44(local_a0[0].m_begin.m_stride._4_4_,(undefined4)local_a0[0].m_begin.m_stride);
  ptVar6 = local_a0[0].m_begin.m_ptr;
  do {
    if (ptVar6 == local_a0[0].m_end.m_ptr && local_a0[0].m_end.m_stride == sVar2) {
LAB_00177b6c:
      uVar5 = (uint)(ptVar6 != local_a0[0].m_end.m_ptr || local_a0[0].m_end.m_stride != sVar2);
LAB_00177b74:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&expectedRowSums.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&values.super__Vector_base<int,_std::allocator<int>_>);
      return uVar5;
    }
    span2d.m_ptr = ptVar6;
    if (sVar2 == 0) {
      span2d.m_ptr = (pointer)0x0;
    }
    span2d.m_size.m_size = sVar2;
    if (sVar2 != 0xc) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x281);
      poVar3 = std::operator<<(poVar3,": error: ");
      poVar3 = std::operator<<(poVar3,"(span2d.Size()) == (size_t(12))");
      poVar3 = std::operator<<(poVar3," was false, expected true.");
      std::endl<char,std::char_traits<char>>(poVar3);
LAB_00177b03:
      uVar5 = 1;
      goto LAB_00177b74;
    }
    MILBlob::Util::Span<const_int,_18446744073709551615UL>::IterateByDimension(&local_100,&span2d,3)
    ;
    ptVar8 = local_100.m_begin.m_ptr;
    lVar4 = 0;
    while ((ptVar8 != local_100.m_end.m_ptr ||
           (local_100.m_begin.m_stride != local_100.m_end.m_stride))) {
      if (local_100.m_begin.m_stride != 4) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x285);
        poVar3 = std::operator<<(poVar3,": error: ");
        poVar3 = std::operator<<(poVar3,"(row.Size()) == (size_t(4))");
        poVar3 = std::operator<<(poVar3," was false, expected true.");
        std::endl<char,std::char_traits<char>>(poVar3);
        goto LAB_00177b03;
      }
      iVar10 = 0;
      for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 4) {
        iVar10 = iVar10 + *(int *)((long)ptVar8 + lVar11);
      }
      piVar1 = expectedRowSums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + lVar4;
      ptVar8 = ptVar8 + 4;
      lVar4 = lVar4 + 1;
      if (iVar10 != *piVar1) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x28c);
        poVar3 = std::operator<<(poVar3,": error: ");
        poVar3 = std::operator<<(poVar3,"(sum) == (expectedRowSums[rowIndex++])");
        poVar3 = std::operator<<(poVar3," was false, expected true.");
        std::endl<char,std::char_traits<char>>(poVar3);
        goto LAB_00177b6c;
      }
    }
    ptVar6 = ptVar6 + 0xc;
  } while( true );
}

Assistant:

int testSpanTestsIterationMultipleDims()
{
    // clang-format off
    const std::vector<int> values = {
        // shape: [2, 3, 4]
        /*0*/
        1, 2, 3, 4,
        5, 6, 7, 8,
        9, 10, 11, 12,
        /*1*/
        1, 2, 3, 4,
        5, 6, 7, 8,
        9, 10, 11, 12
    };
    // clang-format on

    const std::vector<int> expectedRowSums = {10, 26, 42};

    auto span = MakeSpan(values);

    for (auto span2d : span.IterateByDimension(2)) {
        ML_ASSERT_EQ(span2d.Size(), size_t(12));

        size_t rowIndex = 0;
        for (auto row : span2d.IterateByDimension(3)) {
            ML_ASSERT_EQ(row.Size(), size_t(4));

            int sum = 0;
            for (auto i : row) {
                sum += i;
            }

            ML_ASSERT_EQ(sum, expectedRowSums[rowIndex++]);
        }
    }

    return 0;
}